

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

const_reference __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::at
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos)

{
  const_reference pcVar1;
  out_of_range *this_00;
  allocator local_49;
  out_of_range local_48 [16];
  string local_38 [32];
  
  if (pos < this->size_) {
    pcVar1 = data_at(this,pos);
    return pcVar1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"nonstd::string_view::at()",&local_49);
  std::out_of_range::out_of_range(local_48,local_38);
  std::out_of_range::out_of_range(this_00,local_48);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

at( size_type pos ) const
    {
#if nssv_CONFIG_NO_EXCEPTIONS
        assert( pos < size() );
#else
        if ( pos >= size() )
        {
            throw std::out_of_range("nonstd::string_view::at()");
        }
#endif
        return data_at( pos );
    }